

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceArguments.cpp
# Opt level: O1

HRESULT __thiscall
Js::StackTraceArguments::ToString
          (StackTraceArguments *this,LPCWSTR functionName,ScriptContext *scriptContext,
          LPCWSTR *outResult)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  CompoundString *this_00;
  JavascriptString *s;
  char16 *pcVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ulong uVar8;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  uVar1 = this->types;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                      ExceptionType_OutOfMemory);
  this_00 = CompoundString::NewWithCharCapacity
                      (0x28,(scriptContext->super_ScriptContextBase).javascriptLibrary);
  CompoundString::AppendCharsSz(this_00,functionName);
  if ((uVar1 >> 0x3d & 1) == 0) {
    CompoundString::AppendChars(this_00,L'(');
  }
  if ((uVar1 & 0xcfffffffffffffff) != 0) {
    uVar8 = 0;
    uVar7 = uVar1 & 0xcfffffffffffffff;
    do {
      if (uVar8 != 0) {
        CompoundString::AppendGeneric<3u,Js::CompoundString>
                  ((char16 (*) [3])0x1030b88,true,this_00,true);
      }
      s = TypeCodeToTypeName((uint)uVar7 & 7,scriptContext);
      CompoundString::AppendChars(this_00,s);
      if (0x12 < uVar8) break;
      uVar8 = uVar8 + 1;
      bVar3 = 7 < uVar7;
      uVar7 = uVar7 >> 3;
    } while (bVar3);
  }
  if ((uVar1 >> 0x3c & 1) != 0) {
    CompoundString::AppendGeneric<6u,Js::CompoundString>((char16 (*) [6])L", ...",true,this_00,true)
    ;
  }
  if ((uVar1 >> 0x3d & 1) == 0) {
    CompoundString::AppendChars(this_00,L')');
  }
  pcVar5 = JavascriptString::GetString((JavascriptString *)this_00);
  *outResult = pcVar5;
  BVar4 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/StackTraceArguments.cpp"
                                ,0x7e,
                                "(!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                                "!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return 0;
}

Assistant:

HRESULT StackTraceArguments::ToString(LPCWSTR functionName, Js::ScriptContext *scriptContext, _In_ LPCWSTR *outResult) const
    {
        HRESULT hr = S_OK;
        uint64 argumentsTypes = types;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            CompoundString *const stringBuilder = CompoundString::NewWithCharCapacity(40, scriptContext->GetLibrary());
            stringBuilder->AppendCharsSz(functionName);
            bool calleIsGlobalFunction = (argumentsTypes & fCallerIsGlobal) != 0;
            bool toManyArgs = (argumentsTypes & fTooManyArgs) != 0;
            argumentsTypes &= ~fCallerIsGlobal; // erase flags to prevent them from being treated as values
            argumentsTypes &= ~fTooManyArgs;
            if (!calleIsGlobalFunction)
            {
                stringBuilder->AppendChars(_u('('));
            }
            for (uint64 i = 0; i < MaxNumberOfDisplayedArgumentsInStack && argumentsTypes != 0; i ++)
            {
                if (i > 0)
                {
                    stringBuilder->AppendChars(_u(", "));
                }
                stringBuilder->AppendChars(TypeCodeToTypeName(argumentsTypes & 7, scriptContext)); // we use 3 bits to store one code
                argumentsTypes >>= 3;
            }
            if (toManyArgs)
            {
                stringBuilder->AppendChars(_u(", ..."));
            }
            if (!calleIsGlobalFunction)
            {
                stringBuilder->AppendChars(_u(')'));
            }
            *outResult = stringBuilder->GetString();
        }